

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int luaK_exp2RK(FuncState *fs,expdesc *e)

{
  uint uVar1;
  int b;
  TValue local_30;
  TValue k;
  
  luaK_exp2val(fs,e);
  switch(e->k) {
  case VNIL:
    local_30.tt_ = 0;
    k.value_ = (Value)fs->ls->h;
    k.tt_ = 0x45;
    uVar1 = addk(fs,&k,&local_30);
    break;
  case VTRUE:
    b = 1;
    goto LAB_0011d556;
  case VFALSE:
    b = 0;
LAB_0011d556:
    uVar1 = boolK(fs,b);
    break;
  case VK:
    uVar1 = (e->u).info;
    goto LAB_0011d56c;
  case VKFLT:
    uVar1 = luaK_numberK(fs,(e->u).nval);
    break;
  case VKINT:
    uVar1 = luaK_intK(fs,(e->u).ival);
    break;
  default:
    goto switchD_0011d509_default;
  }
  (e->u).info = uVar1;
LAB_0011d56c:
  e->k = VK;
  if ((int)uVar1 < 0x100) {
    uVar1 = uVar1 | 0x100;
  }
  else {
switchD_0011d509_default:
    uVar1 = luaK_exp2anyreg(fs,e);
  }
  return uVar1;
}

Assistant:

int luaK_exp2RK(FuncState *fs, expdesc *e) {
    luaK_exp2val(fs, e);
    switch (e->k) {  /* move constants to 'k' */
        case VTRUE:
            e->u.info = boolK(fs, 1);
            goto vk;
        case VFALSE:
            e->u.info = boolK(fs, 0);
            goto vk;
        case VNIL:
            e->u.info = nilK(fs);
            goto vk;
        case VKINT:
            e->u.info = luaK_intK(fs, e->u.ival);
            goto vk;
        case VKFLT:
            e->u.info = luaK_numberK(fs, e->u.nval);
            goto vk;
        case VK:
        vk:
            e->k = VK;
            if (e->u.info <= MAXINDEXRK)  /* constant fits in 'argC'? */
                return RKASK(e->u.info);
            else break;
        default:
            break;
    }
    /* not a constant in the right range: put it in a register */
    return luaK_exp2anyreg(fs, e);
}